

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this)

{
  string *psVar1;
  cmNinjaTargetGenerator *this_local;
  
  psVar1 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::GetTargetName() const
{
  return this->GeneratorTarget->GetName();
}